

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int32_t iVar2;
  ImGuiIO *pIVar3;
  ImDrawData *drawData;
  long lVar4;
  float fVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ImVec2 local_120;
  int width;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  ImGuiWS imguiWS;
  int height;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  ImVec2 local_e8;
  ImVec2 local_e0;
  float local_d4;
  ImGuiIO *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  VSync vsync;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string httpRoot;
  
  printf("Usage: %s [port] [http-root]\n",*argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&httpRoot,"../examples",(allocator<char> *)&vsync);
  uVar1 = 5000;
  if ((1 < argc) && (uVar1 = atoi(argv[1]), argc != 2)) {
    std::__cxx11::string::assign((char *)&httpRoot);
  }
  ImGui::DebugCheckVersionAndDataLayout("1.88 WIP",0x37d0,0x418,8,0x10,0x14,2);
  ImGui::CreateContext((ImFontAtlas *)0x0);
  local_d0 = ImGui::GetIO();
  ImGui::StyleColorsDark((ImGuiStyle *)0x0);
  ImGuiWS::ImGuiWS(&imguiWS);
  std::operator+(&local_70,&httpRoot,"/textures-null");
  std::__cxx11::string::string<std::allocator<char>>((string *)&vsync,"",(allocator<char> *)&width);
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"index.html",(allocator<char> *)&height);
  __l._M_len = 2;
  __l._M_array = (iterator)&vsync;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_c8,__l,(allocator_type *)&local_120);
  ImGuiWS::init(&imguiWS,(EVP_PKEY_CTX *)(ulong)uVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&vsync.tStep_us + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_70);
  pIVar3 = ImGui::GetIO();
  ImFontAtlas::GetTexDataAsAlpha8(pIVar3->Fonts,(uchar **)&vsync,&width,&height,(int *)0x0);
  ImGuiWS::setTexture(&imguiWS,0,Alpha8,width,height,(char *)vsync.tStep_us);
  regenerate(&imguiWS,0);
  vsync.tStep_us = 0x411a;
  lVar4 = std::chrono::_V2::system_clock::now();
  vsync.tLast_us = lVar4 / 1000;
  vsync.tNext_us = vsync.tLast_us + vsync.tStep_us;
  do {
    main::counter = main::counter + 1;
    if (main::counter % 300 == 0) {
      regenerate(&imguiWS,main::counter);
    }
    (local_d0->DisplaySize).x = 640.0;
    (local_d0->DisplaySize).y = 480.0;
    fVar5 = VSync::delta_s(&vsync);
    local_d0->DeltaTime = fVar5;
    ImGui::NewFrame();
    width = 0x41a00000;
    fStack_114 = 20.0;
    height = 0;
    fStack_f4 = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)&width,0,(ImVec2 *)&height);
    width = 0x43c80000;
    fStack_114 = 100.0;
    ImGui::SetNextWindowSize((ImVec2 *)&width,0);
    ImGui::Begin("Hello, world!",(bool *)0x0,0);
    ImGuiWS::nConnected(&imguiWS);
    ImGui::Text("Connected clients: %d");
    pIVar3 = ImGui::GetIO();
    local_d4 = pIVar3->Framerate;
    pIVar3 = ImGui::GetIO();
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)",SUB84((double)(1000.0 / local_d4),0),
                (double)pIVar3->Framerate);
    ImGui::End();
    width = 0x41a00000;
    fStack_114 = 140.0;
    height = 0;
    fStack_f4 = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)&width,0,(ImVec2 *)&height);
    width = 0x43d20000;
    fStack_114 = 200.0;
    ImGui::SetNextWindowSize((ImVec2 *)&width,0);
    ImGui::Begin("Some random images",(bool *)0x0,0);
    ImGui::Text("The images are regenerated on the server every ~5 seconds");
    local_e0.x = 0.0;
    local_e0.y = 0.0;
    local_120.x = 128.0;
    local_120.y = 128.0;
    local_e8.x = 1.0;
    local_e8.y = 1.0;
    width = 0x3f800000;
    fStack_114 = 1.0;
    fStack_110 = 1.0;
    fStack_10c = 1.0;
    height = 0x3f800000;
    fStack_f4 = 1.0;
    fStack_f0 = 1.0;
    fStack_ec = 0.5;
    ImGui::Image((ImTextureID)(ulong)g_texture0Id,&local_120,&local_e0,&local_e8,(ImVec4 *)&width,
                 (ImVec4 *)&height);
    ImGui::SameLine(0.0,-1.0);
    local_e0.x = 0.0;
    local_e0.y = 0.0;
    local_120.x = 128.0;
    local_120.y = 128.0;
    local_e8.x = 1.0;
    local_e8.y = 1.0;
    width = 0x3f800000;
    fStack_114 = 1.0;
    fStack_110 = 1.0;
    fStack_10c = 1.0;
    height = 0x3f800000;
    fStack_f4 = 1.0;
    fStack_f0 = 1.0;
    fStack_ec = 0.5;
    ImGui::Image((ImTextureID)(ulong)g_texture1Id,&local_120,&local_e0,&local_e8,(ImVec4 *)&width,
                 (ImVec4 *)&height);
    ImGui::SameLine(0.0,-1.0);
    local_e0.x = 0.0;
    local_e0.y = 0.0;
    local_120.x = 128.0;
    local_120.y = 128.0;
    local_e8.x = 1.0;
    local_e8.y = 1.0;
    width = 0x3f800000;
    fStack_114 = 1.0;
    fStack_110 = 1.0;
    fStack_10c = 1.0;
    height = 0x3f800000;
    fStack_f4 = 1.0;
    fStack_f0 = 1.0;
    fStack_ec = 0.5;
    ImGui::Image((ImTextureID)(ulong)g_texture2Id,&local_120,&local_e0,&local_e8,(ImVec4 *)&width,
                 (ImVec4 *)&height);
    ImGui::End();
    width = 0x41a00000;
    fStack_114 = 360.0;
    height = 0;
    fStack_f4 = 0.0;
    ImGui::SetNextWindowPos((ImVec2 *)&width,0,(ImVec2 *)&height);
    ImGui::ShowAboutWindow((bool *)0x0);
    ImGui::Render();
    drawData = ImGui::GetDrawData();
    ImGuiWS::setDrawData(&imguiWS,drawData);
    do {
      VSync::wait(&vsync,drawData);
      iVar2 = ImGuiWS::nConnected(&imguiWS);
    } while (iVar2 == 0);
  } while( true );
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s [port] [http-root]\n", argv[0]);

    int port = 5000;
    std::string httpRoot = "../examples";

    if (argc > 1) port = atoi(argv[1]);
    if (argc > 2) httpRoot = argv[2];

    // init dear imgui
    IMGUI_CHECKVERSION();
    ImGui::CreateContext();
    ImGuiIO& io = ImGui::GetIO(); (void)io;

    ImGui::StyleColorsDark();

    // setup imgui-ws
    ImGuiWS imguiWS;
    imguiWS.init(port, httpRoot + "/textures-null", { "", "index.html" });

    // prepare font texture
    {
        unsigned char * pixels;
        int width, height;
        ImGui::GetIO().Fonts->GetTexDataAsAlpha8(&pixels, &width, &height);
        imguiWS.setTexture(0, ImGuiWS::Texture::Type::Alpha8, width, height, (const char *) pixels);
    }

    // generate some random textures
    regenerate(imguiWS, 0);

    VSync vsync;

    while (true) {
        // regenerate random textures every ~5 seconds
        {
            static int counter = 0;
            if (++counter % (5*60) == 0) {
                regenerate(imguiWS, counter);
            }
        }

        io.DisplaySize = ImVec2(640, 480);
        io.DeltaTime = vsync.delta_s();

        ImGui::NewFrame();

        ImGui::SetNextWindowPos({ 20, 20 });
        ImGui::SetNextWindowSize({ 400, 100 });
        ImGui::Begin("Hello, world!");
        ImGui::Text("Connected clients: %d", imguiWS.nConnected());
        ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / ImGui::GetIO().Framerate, ImGui::GetIO().Framerate);
        ImGui::End();

        ImGui::SetNextWindowPos({ 20, 140 });
        ImGui::SetNextWindowSize({ 420, 200 });
        ImGui::Begin("Some random images");
        ImGui::Text("The images are regenerated on the server every ~5 seconds");
        ImGui::Image((void *)(intptr_t) g_texture0Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::SameLine();
        ImGui::Image((void *)(intptr_t) g_texture1Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::SameLine();
        ImGui::Image((void *)(intptr_t) g_texture2Id, { 128, 128 }, ImVec2(0,0), ImVec2(1,1), ImVec4(1.0f,1.0f,1.0f,1.0f), ImVec4(1.0f,1.0f,1.0f,0.5f));
        ImGui::End();

        ImGui::SetNextWindowPos({ 20, 360 });
        ImGui::ShowAboutWindow();

        // generate ImDrawData
        ImGui::Render();

        // store ImDrawData for asynchronous dispatching to WS clients
        imguiWS.setDrawData(ImGui::GetDrawData());

        // if not clients are connected, just sleep to save CPU
        do {
            vsync.wait();
        } while (imguiWS.nConnected() == 0);
    }

    ImGui::DestroyContext();

    return 0;
}